

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O1

void VP8LHistogramStoreRefs(VP8LBackwardRefs *refs,VP8LHistogram *histo)

{
  VP8LRefsCursor c;
  VP8LRefsCursor local_28;
  
  VP8LRefsCursorInit(&local_28,refs);
  while (local_28.cur_pos != (PixOrCopy *)0x0) {
    VP8LHistogramAddSinglePixOrCopy(histo,local_28.cur_pos,(_func_int_int_int *)0x0,0);
    local_28.cur_pos = local_28.cur_pos + 1;
    if (local_28.cur_pos == local_28.last_pos_) {
      VP8LRefsCursorNextBlock(&local_28);
    }
  }
  return;
}

Assistant:

void VP8LHistogramStoreRefs(const VP8LBackwardRefs* const refs,
                            VP8LHistogram* const histo) {
  VP8LRefsCursor c = VP8LRefsCursorInit(refs);
  while (VP8LRefsCursorOk(&c)) {
    VP8LHistogramAddSinglePixOrCopy(histo, c.cur_pos, NULL, 0);
    VP8LRefsCursorNext(&c);
  }
}